

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash_impl.h
# Opt level: O2

void secp256k1_sha256_write(secp256k1_sha256 *hash,uchar *data,size_t len)

{
  uint uVar1;
  uint uVar2;
  uint32_t uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint32_t uVar7;
  int iVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  uint uVar16;
  uint uVar17;
  uint uVar18;
  uint uVar19;
  uint uVar20;
  uint uVar21;
  uint uVar22;
  uint uVar23;
  uint uVar24;
  uint uVar25;
  uint uVar26;
  uint uVar27;
  uint uVar28;
  uint uVar29;
  uint uVar30;
  uint uVar31;
  uint uVar32;
  uint uVar33;
  uint uVar34;
  uint uVar36;
  uint uVar37;
  uint uVar38;
  uint uVar39;
  uint uVar40;
  uint uVar41;
  uint uVar42;
  uint uVar43;
  uint uVar44;
  uint uVar45;
  uint uVar46;
  uint uVar47;
  uint uVar48;
  uint uVar49;
  uint uVar50;
  uint uVar51;
  uint uVar52;
  uint uVar53;
  uint uVar54;
  uint uVar55;
  uint uVar56;
  uint uVar57;
  ulong __n;
  uint uVar58;
  uint uVar59;
  uint uVar60;
  uint uVar61;
  uint uVar62;
  uint uVar63;
  uint uVar64;
  uchar *local_d0;
  ulong uVar35;
  
  uVar27 = (uint)hash->bytes & 0x3f;
  hash->bytes = hash->bytes + len;
  local_d0 = data;
  while( true ) {
    uVar35 = (ulong)uVar27;
    __n = 0x40 - uVar35;
    if (len < __n) break;
    memcpy((void *)((long)hash->buf + uVar35),local_d0,__n);
    local_d0 = local_d0 + __n;
    uVar27 = hash->s[0];
    uVar1 = hash->s[1];
    uVar2 = hash->s[2];
    uVar3 = hash->s[3];
    uVar4 = hash->s[4];
    uVar5 = hash->s[5];
    uVar6 = hash->s[6];
    uVar7 = hash->s[7];
    uVar10 = hash->buf[0];
    uVar28 = uVar10 >> 0x18 | (uVar10 & 0xff0000) >> 8 | (uVar10 & 0xff00) << 8 | uVar10 << 0x18;
    iVar8 = ((uVar6 ^ uVar5) & uVar4 ^ uVar6) + uVar7 +
            ((uVar4 << 7 | uVar4 >> 0x19) ^
            (uVar4 << 0x15 | uVar4 >> 0xb) ^ (uVar4 << 0x1a | uVar4 >> 6));
    uVar9 = ((uVar1 | uVar27) & uVar2 | uVar1 & uVar27) +
            ((uVar27 << 10 | uVar27 >> 0x16) ^
            (uVar27 << 0x13 | uVar27 >> 0xd) ^ (uVar27 << 0x1e | uVar27 >> 2)) +
            uVar28 + iVar8 + 0x428a2f98;
    uVar29 = uVar3 + iVar8 + uVar28 + 0x428a2f98;
    uVar11 = (uVar29 * 0x80 | uVar29 >> 0x19) ^
             (uVar29 * 0x200000 | uVar29 >> 0xb) ^ (uVar29 * 0x4000000 | uVar29 >> 6);
    uVar10 = hash->buf[1];
    uVar34 = uVar10 >> 0x18 | (uVar10 & 0xff0000) >> 8 | (uVar10 & 0xff00) << 8;
    uVar21 = uVar34 | uVar10 << 0x18;
    iVar8 = ((uVar5 ^ uVar4) & uVar29 ^ uVar5) + uVar21 + uVar6;
    uVar36 = iVar8 + uVar11 + uVar2 + 0x71374491;
    uVar12 = ((uVar9 | uVar27) & uVar1 | uVar9 & uVar27) +
             ((uVar9 * 0x400 | uVar9 >> 0x16) ^
             (uVar9 * 0x80000 | uVar9 >> 0xd) ^ (uVar9 * 0x40000000 | uVar9 >> 2)) +
             iVar8 + uVar11 + 0x71374491;
    uVar22 = (uVar36 * 0x80 | uVar36 >> 0x19) ^
             (uVar36 * 0x200000 | uVar36 >> 0xb) ^ (uVar36 * 0x4000000 | uVar36 >> 6);
    uVar11 = hash->buf[2];
    uVar38 = uVar11 >> 0x18 | (uVar11 & 0xff0000) >> 8 | (uVar11 & 0xff00) << 8;
    uVar40 = uVar38 | uVar11 << 0x18;
    iVar8 = ((uVar29 ^ uVar4) & uVar36 ^ uVar4) + uVar40 + uVar5;
    uVar44 = uVar1 + iVar8 + uVar22 + 0xb5c0fbcf;
    uVar14 = ((uVar12 | uVar9) & uVar27 | uVar12 & uVar9) +
             ((uVar12 * 0x400 | uVar12 >> 0x16) ^
             (uVar12 * 0x80000 | uVar12 >> 0xd) ^ (uVar12 * 0x40000000 | uVar12 >> 2)) +
             uVar22 + iVar8 + -0x4a3f0431;
    uVar23 = (uVar44 * 0x80 | uVar44 >> 0x19) ^
             (uVar44 * 0x200000 | uVar44 >> 0xb) ^ (uVar44 * 0x4000000 | uVar44 >> 6);
    uVar22 = hash->buf[3];
    uVar39 = uVar22 >> 0x18 | (uVar22 & 0xff0000) >> 8 | (uVar22 & 0xff00) << 8;
    uVar48 = uVar39 | uVar22 << 0x18;
    iVar8 = ((uVar36 ^ uVar29) & uVar44 ^ uVar29) + uVar48 + uVar4;
    uVar24 = ((uVar14 | uVar12) & uVar9 | uVar14 & uVar12) +
             ((uVar14 * 0x400 | uVar14 >> 0x16) ^
             (uVar14 * 0x80000 | uVar14 >> 0xd) ^ (uVar14 * 0x40000000 | uVar14 >> 2)) +
             iVar8 + uVar23 + -0x164a245b;
    uVar49 = iVar8 + uVar23 + uVar27 + 0xe9b5dba5;
    uVar23 = hash->buf[4];
    uVar42 = uVar23 >> 0x18 | (uVar23 & 0xff0000) >> 8 | (uVar23 & 0xff00) << 8;
    uVar17 = uVar42 | uVar23 << 0x18;
    iVar8 = ((uVar49 * 0x80 | uVar49 >> 0x19) ^
            (uVar49 * 0x200000 | uVar49 >> 0xb) ^ (uVar49 * 0x4000000 | uVar49 >> 6)) +
            uVar29 + uVar17 + ((uVar44 ^ uVar36) & uVar49 ^ uVar36) + 0x3956c25b;
    uVar9 = uVar9 + iVar8;
    uVar30 = ((uVar24 | uVar14) & uVar12 | uVar24 & uVar14) +
             ((uVar24 * 0x400 | uVar24 >> 0x16) ^
             (uVar24 * 0x80000 | uVar24 >> 0xd) ^ (uVar24 * 0x40000000 | uVar24 >> 2)) + iVar8;
    uVar29 = hash->buf[5];
    uVar43 = uVar29 >> 0x18 | (uVar29 & 0xff0000) >> 8 | (uVar29 & 0xff00) << 8;
    uVar18 = uVar43 | uVar29 << 0x18;
    iVar8 = uVar36 + uVar18 + ((uVar49 ^ uVar44) & uVar9 ^ uVar44) +
            ((uVar9 * 0x80 | uVar9 >> 0x19) ^
            (uVar9 * 0x200000 | uVar9 >> 0xb) ^ (uVar9 * 0x4000000 | uVar9 >> 6)) + 0x59f111f1;
    uVar12 = uVar12 + iVar8;
    uVar41 = ((uVar30 | uVar24) & uVar14 | uVar30 & uVar24) +
             ((uVar30 * 0x400 | uVar30 >> 0x16) ^
             (uVar30 * 0x80000 | uVar30 >> 0xd) ^ (uVar30 * 0x40000000 | uVar30 >> 2)) + iVar8;
    uVar36 = hash->buf[6];
    uVar46 = uVar36 >> 0x18 | (uVar36 & 0xff0000) >> 8 | (uVar36 & 0xff00) << 8;
    uVar19 = uVar46 | uVar36 << 0x18;
    iVar8 = ((uVar12 * 0x80 | uVar12 >> 0x19) ^
            (uVar12 * 0x200000 | uVar12 >> 0xb) ^ (uVar12 * 0x4000000 | uVar12 >> 6)) +
            uVar44 + uVar19 + ((uVar9 ^ uVar49) & uVar12 ^ uVar49) + -0x6dc07d5c;
    uVar14 = uVar14 + iVar8;
    uVar15 = ((uVar41 | uVar30) & uVar24 | uVar41 & uVar30) +
             ((uVar41 * 0x400 | uVar41 >> 0x16) ^
             (uVar41 * 0x80000 | uVar41 >> 0xd) ^ (uVar41 * 0x40000000 | uVar41 >> 2)) + iVar8;
    uVar44 = hash->buf[7];
    uVar47 = uVar44 >> 0x18 | (uVar44 & 0xff0000) >> 8 | (uVar44 & 0xff00) << 8;
    uVar20 = uVar47 | uVar44 << 0x18;
    iVar8 = ((uVar14 * 0x80 | uVar14 >> 0x19) ^
            (uVar14 * 0x200000 | uVar14 >> 0xb) ^ (uVar14 * 0x4000000 | uVar14 >> 6)) +
            uVar49 + uVar20 + ((uVar12 ^ uVar9) & uVar14 ^ uVar9) + -0x54e3a12b;
    uVar24 = uVar24 + iVar8;
    uVar59 = ((uVar15 | uVar41) & uVar30 | uVar15 & uVar41) +
             ((uVar15 * 0x400 | uVar15 >> 0x16) ^
             (uVar15 * 0x80000 | uVar15 >> 0xd) ^ (uVar15 * 0x40000000 | uVar15 >> 2)) + iVar8;
    uVar49 = hash->buf[8];
    uVar54 = uVar49 >> 0x18 | (uVar49 & 0xff0000) >> 8 | (uVar49 & 0xff00) << 8;
    uVar50 = uVar54 | uVar49 << 0x18;
    iVar8 = uVar9 + uVar50 + ((uVar14 ^ uVar12) & uVar24 ^ uVar12) +
            ((uVar24 * 0x80 | uVar24 >> 0x19) ^
            (uVar24 * 0x200000 | uVar24 >> 0xb) ^ (uVar24 * 0x4000000 | uVar24 >> 6)) + -0x27f85568;
    uVar30 = uVar30 + iVar8;
    uVar45 = ((uVar59 | uVar15) & uVar41 | uVar59 & uVar15) +
             ((uVar59 * 0x400 | uVar59 >> 0x16) ^
             (uVar59 * 0x80000 | uVar59 >> 0xd) ^ (uVar59 * 0x40000000 | uVar59 >> 2)) + iVar8;
    uVar9 = hash->buf[9];
    uVar55 = uVar9 >> 0x18 | (uVar9 & 0xff0000) >> 8 | (uVar9 & 0xff00) << 8;
    uVar51 = uVar55 | uVar9 << 0x18;
    iVar8 = ((uVar30 * 0x80 | uVar30 >> 0x19) ^
            (uVar30 * 0x200000 | uVar30 >> 0xb) ^ (uVar30 * 0x4000000 | uVar30 >> 6)) +
            uVar12 + uVar51 + ((uVar24 ^ uVar14) & uVar30 ^ uVar14) + 0x12835b01;
    uVar41 = uVar41 + iVar8;
    uVar13 = ((uVar45 | uVar59) & uVar15 | uVar45 & uVar59) +
             ((uVar45 * 0x400 | uVar45 >> 0x16) ^
             (uVar45 * 0x80000 | uVar45 >> 0xd) ^ (uVar45 * 0x40000000 | uVar45 >> 2)) + iVar8;
    uVar12 = hash->buf[10];
    uVar57 = uVar12 >> 0x18 | (uVar12 & 0xff0000) >> 8 | (uVar12 & 0xff00) << 8;
    uVar52 = uVar57 | uVar12 << 0x18;
    iVar8 = ((uVar41 * 0x80 | uVar41 >> 0x19) ^
            (uVar41 * 0x200000 | uVar41 >> 0xb) ^ (uVar41 * 0x4000000 | uVar41 >> 6)) +
            uVar14 + uVar52 + ((uVar30 ^ uVar24) & uVar41 ^ uVar24) + 0x243185be;
    uVar15 = uVar15 + iVar8;
    uVar56 = ((uVar13 | uVar45) & uVar59 | uVar13 & uVar45) +
             ((uVar13 * 0x400 | uVar13 >> 0x16) ^
             (uVar13 * 0x80000 | uVar13 >> 0xd) ^ (uVar13 * 0x40000000 | uVar13 >> 2)) + iVar8;
    uVar14 = hash->buf[0xb];
    uVar58 = uVar14 >> 0x18 | (uVar14 & 0xff0000) >> 8 | (uVar14 & 0xff00) << 8;
    uVar37 = uVar58 | uVar14 << 0x18;
    iVar8 = ((uVar15 * 0x80 | uVar15 >> 0x19) ^
            (uVar15 * 0x200000 | uVar15 >> 0xb) ^ (uVar15 * 0x4000000 | uVar15 >> 6)) +
            uVar24 + uVar37 + ((uVar41 ^ uVar30) & uVar15 ^ uVar30) + 0x550c7dc3;
    uVar59 = uVar59 + iVar8;
    uVar64 = ((uVar56 | uVar13) & uVar45 | uVar56 & uVar13) +
             ((uVar56 * 0x400 | uVar56 >> 0x16) ^
             (uVar56 * 0x80000 | uVar56 >> 0xd) ^ (uVar56 * 0x40000000 | uVar56 >> 2)) + iVar8;
    uVar24 = hash->buf[0xc];
    uVar60 = uVar24 >> 0x18 | (uVar24 & 0xff0000) >> 8 | (uVar24 & 0xff00) << 8;
    uVar25 = uVar60 | uVar24 << 0x18;
    iVar8 = ((uVar59 * 0x80 | uVar59 >> 0x19) ^
            (uVar59 * 0x200000 | uVar59 >> 0xb) ^ (uVar59 * 0x4000000 | uVar59 >> 6)) +
            uVar30 + uVar25 + ((uVar15 ^ uVar41) & uVar59 ^ uVar41) + 0x72be5d74;
    uVar45 = uVar45 + iVar8;
    uVar31 = ((uVar64 | uVar56) & uVar13 | uVar64 & uVar56) +
             ((uVar64 * 0x400 | uVar64 >> 0x16) ^
             (uVar64 * 0x80000 | uVar64 >> 0xd) ^ (uVar64 * 0x40000000 | uVar64 >> 2)) + iVar8;
    uVar30 = hash->buf[0xd];
    uVar61 = uVar30 >> 0x18 | (uVar30 & 0xff0000) >> 8 | (uVar30 & 0xff00) << 8;
    uVar26 = uVar61 | uVar30 << 0x18;
    iVar8 = ((uVar45 * 0x80 | uVar45 >> 0x19) ^
            (uVar45 * 0x200000 | uVar45 >> 0xb) ^ (uVar45 * 0x4000000 | uVar45 >> 6)) +
            uVar41 + uVar26 + ((uVar59 ^ uVar15) & uVar45 ^ uVar15) + -0x7f214e02;
    uVar13 = uVar13 + iVar8;
    uVar32 = ((uVar31 | uVar64) & uVar56 | uVar31 & uVar64) +
             ((uVar31 * 0x400 | uVar31 >> 0x16) ^
             (uVar31 * 0x80000 | uVar31 >> 0xd) ^ (uVar31 * 0x40000000 | uVar31 >> 2)) + iVar8;
    uVar41 = hash->buf[0xe];
    uVar62 = uVar41 >> 0x18 | (uVar41 & 0xff0000) >> 8 | (uVar41 & 0xff00) << 8;
    uVar53 = uVar62 | uVar41 << 0x18;
    iVar8 = ((uVar13 * 0x80 | uVar13 >> 0x19) ^
            (uVar13 * 0x200000 | uVar13 >> 0xb) ^ (uVar13 * 0x4000000 | uVar13 >> 6)) +
            uVar15 + uVar53 + ((uVar45 ^ uVar59) & uVar13 ^ uVar59) + -0x6423f959;
    uVar56 = uVar56 + iVar8;
    uVar33 = ((uVar32 | uVar31) & uVar64 | uVar32 & uVar31) +
             ((uVar32 * 0x400 | uVar32 >> 0x16) ^
             (uVar32 * 0x80000 | uVar32 >> 0xd) ^ (uVar32 * 0x40000000 | uVar32 >> 2)) + iVar8;
    uVar15 = hash->buf[0xf];
    uVar63 = uVar15 >> 0x18 | (uVar15 & 0xff0000) >> 8 | (uVar15 & 0xff00) << 8;
    uVar16 = uVar63 | uVar15 << 0x18;
    iVar8 = ((uVar56 * 0x80 | uVar56 >> 0x19) ^
            (uVar56 * 0x200000 | uVar56 >> 0xb) ^ (uVar56 * 0x4000000 | uVar56 >> 6)) +
            uVar59 + uVar16 + ((uVar13 ^ uVar45) & uVar56 ^ uVar45) + -0x3e640e8c;
    uVar64 = uVar64 + iVar8;
    uVar59 = ((uVar33 | uVar32) & uVar31 | uVar33 & uVar32) +
             ((uVar33 * 0x400 | uVar33 >> 0x16) ^
             (uVar33 * 0x80000 | uVar33 >> 0xd) ^ (uVar33 * 0x40000000 | uVar33 >> 2)) + iVar8;
    uVar34 = uVar28 + uVar51 +
             (uVar21 >> 3 ^
             (uVar34 << 0xe | uVar21 >> 0x12) ^ ((uVar10 >> 0x18) << 0x19 | uVar21 >> 7)) +
             (uVar53 >> 10 ^ (uVar62 << 0xd | uVar53 >> 0x13) ^ (uVar62 << 0xf | uVar53 >> 0x11));
    iVar8 = ((uVar64 * 0x80 | uVar64 >> 0x19) ^
            (uVar64 * 0x200000 | uVar64 >> 0xb) ^ (uVar64 * 0x4000000 | uVar64 >> 6)) +
            uVar45 + uVar34 + ((uVar56 ^ uVar13) & uVar64 ^ uVar13) + -0x1b64963f;
    uVar31 = uVar31 + iVar8;
    uVar28 = ((uVar59 | uVar33) & uVar32 | uVar59 & uVar33) +
             ((uVar59 * 0x400 | uVar59 >> 0x16) ^
             (uVar59 * 0x80000 | uVar59 >> 0xd) ^ (uVar59 * 0x40000000 | uVar59 >> 2)) + iVar8;
    uVar21 = uVar21 + uVar52 +
             (uVar40 >> 3 ^
             (uVar38 << 0xe | uVar40 >> 0x12) ^ ((uVar11 >> 0x18) << 0x19 | uVar40 >> 7)) +
             (uVar16 >> 10 ^ (uVar63 << 0xd | uVar16 >> 0x13) ^ (uVar63 << 0xf | uVar16 >> 0x11));
    iVar8 = ((uVar31 * 0x80 | uVar31 >> 0x19) ^
            (uVar31 * 0x200000 | uVar31 >> 0xb) ^ (uVar31 * 0x4000000 | uVar31 >> 6)) +
            uVar13 + uVar21 + ((uVar64 ^ uVar56) & uVar31 ^ uVar56) + -0x1041b87a;
    uVar32 = uVar32 + iVar8;
    uVar38 = ((uVar28 | uVar59) & uVar33 | uVar28 & uVar59) +
             ((uVar28 * 0x400 | uVar28 >> 0x16) ^
             (uVar28 * 0x80000 | uVar28 >> 0xd) ^ (uVar28 * 0x40000000 | uVar28 >> 2)) + iVar8;
    uVar39 = uVar40 + uVar37 +
             (uVar48 >> 3 ^
             (uVar39 << 0xe | uVar48 >> 0x12) ^ ((uVar22 >> 0x18) << 0x19 | uVar48 >> 7)) +
             (uVar34 >> 10 ^ (uVar34 * 0x2000 | uVar34 >> 0x13) ^ (uVar34 * 0x8000 | uVar34 >> 0x11)
             );
    iVar8 = ((uVar32 * 0x80 | uVar32 >> 0x19) ^
            (uVar32 * 0x200000 | uVar32 >> 0xb) ^ (uVar32 * 0x4000000 | uVar32 >> 6)) +
            uVar56 + uVar39 + ((uVar31 ^ uVar64) & uVar32 ^ uVar64) + 0xfc19dc6;
    uVar33 = uVar33 + iVar8;
    uVar22 = ((uVar38 | uVar28) & uVar59 | uVar38 & uVar28) +
             ((uVar38 * 0x400 | uVar38 >> 0x16) ^
             (uVar38 * 0x80000 | uVar38 >> 0xd) ^ (uVar38 * 0x40000000 | uVar38 >> 2)) + iVar8;
    uVar42 = uVar48 + uVar25 +
             (uVar17 >> 3 ^
             (uVar42 << 0xe | uVar17 >> 0x12) ^ ((uVar23 >> 0x18) << 0x19 | uVar17 >> 7)) +
             (uVar21 >> 10 ^ (uVar21 * 0x2000 | uVar21 >> 0x13) ^ (uVar21 * 0x8000 | uVar21 >> 0x11)
             );
    iVar8 = ((uVar33 * 0x80 | uVar33 >> 0x19) ^
            (uVar33 * 0x200000 | uVar33 >> 0xb) ^ (uVar33 * 0x4000000 | uVar33 >> 6)) +
            uVar64 + uVar42 + ((uVar32 ^ uVar31) & uVar33 ^ uVar31) + 0x240ca1cc;
    uVar59 = uVar59 + iVar8;
    uVar40 = ((uVar22 | uVar38) & uVar28 | uVar22 & uVar38) +
             ((uVar22 * 0x400 | uVar22 >> 0x16) ^
             (uVar22 * 0x80000 | uVar22 >> 0xd) ^ (uVar22 * 0x40000000 | uVar22 >> 2)) + iVar8;
    uVar17 = uVar17 + uVar26 +
             (uVar18 >> 3 ^
             (uVar43 << 0xe | uVar18 >> 0x12) ^ ((uVar29 >> 0x18) << 0x19 | uVar18 >> 7)) +
             (uVar39 >> 10 ^ (uVar39 * 0x2000 | uVar39 >> 0x13) ^ (uVar39 * 0x8000 | uVar39 >> 0x11)
             );
    iVar8 = ((uVar59 * 0x80 | uVar59 >> 0x19) ^
            (uVar59 * 0x200000 | uVar59 >> 0xb) ^ (uVar59 * 0x4000000 | uVar59 >> 6)) +
            uVar31 + uVar17 + ((uVar33 ^ uVar32) & uVar59 ^ uVar32) + 0x2de92c6f;
    uVar28 = uVar28 + iVar8;
    uVar29 = ((uVar40 | uVar22) & uVar38 | uVar40 & uVar22) +
             ((uVar40 * 0x400 | uVar40 >> 0x16) ^
             (uVar40 * 0x80000 | uVar40 >> 0xd) ^ (uVar40 * 0x40000000 | uVar40 >> 2)) + iVar8;
    uVar43 = uVar18 + uVar53 +
             (uVar19 >> 3 ^
             (uVar46 << 0xe | uVar19 >> 0x12) ^ ((uVar36 >> 0x18) << 0x19 | uVar19 >> 7)) +
             (uVar42 >> 10 ^ (uVar42 * 0x2000 | uVar42 >> 0x13) ^ (uVar42 * 0x8000 | uVar42 >> 0x11)
             );
    iVar8 = ((uVar28 * 0x80 | uVar28 >> 0x19) ^
            (uVar28 * 0x200000 | uVar28 >> 0xb) ^ (uVar28 * 0x4000000 | uVar28 >> 6)) +
            uVar32 + uVar43 + ((uVar59 ^ uVar33) & uVar28 ^ uVar33) + 0x4a7484aa;
    uVar38 = uVar38 + iVar8;
    uVar13 = ((uVar29 | uVar40) & uVar22 | uVar29 & uVar40) +
             ((uVar29 * 0x400 | uVar29 >> 0x16) ^
             (uVar29 * 0x80000 | uVar29 >> 0xd) ^ (uVar29 * 0x40000000 | uVar29 >> 2)) + iVar8;
    uVar46 = uVar19 + uVar16 +
             (uVar20 >> 3 ^
             (uVar47 << 0xe | uVar20 >> 0x12) ^ ((uVar44 >> 0x18) << 0x19 | uVar20 >> 7)) +
             (uVar17 >> 10 ^ (uVar17 * 0x2000 | uVar17 >> 0x13) ^ (uVar17 * 0x8000 | uVar17 >> 0x11)
             );
    iVar8 = ((uVar38 * 0x80 | uVar38 >> 0x19) ^
            (uVar38 * 0x200000 | uVar38 >> 0xb) ^ (uVar38 * 0x4000000 | uVar38 >> 6)) +
            uVar33 + uVar46 + ((uVar28 ^ uVar59) & uVar38 ^ uVar59) + 0x5cb0a9dc;
    uVar22 = uVar22 + iVar8;
    uVar36 = ((uVar13 | uVar29) & uVar40 | uVar13 & uVar29) +
             ((uVar13 * 0x400 | uVar13 >> 0x16) ^
             (uVar13 * 0x80000 | uVar13 >> 0xd) ^ (uVar13 * 0x40000000 | uVar13 >> 2)) + iVar8;
    uVar32 = (uVar50 >> 3 ^
             (uVar54 << 0xe | uVar50 >> 0x12) ^ ((uVar49 >> 0x18) << 0x19 | uVar50 >> 7)) + uVar20 +
             uVar34 + (uVar43 >> 10 ^
                      (uVar43 * 0x2000 | uVar43 >> 0x13) ^ (uVar43 * 0x8000 | uVar43 >> 0x11));
    iVar8 = ((uVar22 * 0x80 | uVar22 >> 0x19) ^
            (uVar22 * 0x200000 | uVar22 >> 0xb) ^ (uVar22 * 0x4000000 | uVar22 >> 6)) +
            uVar59 + uVar32 + ((uVar38 ^ uVar28) & uVar22 ^ uVar28) + 0x76f988da;
    uVar40 = uVar40 + iVar8;
    uVar11 = ((uVar36 | uVar13) & uVar29 | uVar36 & uVar13) +
             ((uVar36 * 0x400 | uVar36 >> 0x16) ^
             (uVar36 * 0x80000 | uVar36 >> 0xd) ^ (uVar36 * 0x40000000 | uVar36 >> 2)) + iVar8;
    uVar10 = (uVar51 >> 3 ^
             (uVar55 << 0xe | uVar51 >> 0x12) ^ ((uVar9 >> 0x18) << 0x19 | uVar51 >> 7)) + uVar50 +
             uVar21 + (uVar46 >> 10 ^
                      (uVar46 * 0x2000 | uVar46 >> 0x13) ^ (uVar46 * 0x8000 | uVar46 >> 0x11));
    iVar8 = ((uVar40 * 0x80 | uVar40 >> 0x19) ^
            (uVar40 * 0x200000 | uVar40 >> 0xb) ^ (uVar40 * 0x4000000 | uVar40 >> 6)) +
            uVar28 + uVar10 + ((uVar22 ^ uVar38) & uVar40 ^ uVar38) + -0x67c1aeae;
    uVar29 = uVar29 + iVar8;
    uVar23 = ((uVar11 | uVar36) & uVar13 | uVar11 & uVar36) +
             ((uVar11 * 0x400 | uVar11 >> 0x16) ^
             (uVar11 * 0x80000 | uVar11 >> 0xd) ^ (uVar11 * 0x40000000 | uVar11 >> 2)) + iVar8;
    uVar47 = (uVar52 >> 3 ^
             (uVar57 << 0xe | uVar52 >> 0x12) ^ ((uVar12 >> 0x18) << 0x19 | uVar52 >> 7)) + uVar51 +
             uVar39 + (uVar32 >> 10 ^
                      (uVar32 * 0x2000 | uVar32 >> 0x13) ^ (uVar32 * 0x8000 | uVar32 >> 0x11));
    iVar8 = ((uVar29 * 0x80 | uVar29 >> 0x19) ^
            (uVar29 * 0x200000 | uVar29 >> 0xb) ^ (uVar29 * 0x4000000 | uVar29 >> 6)) +
            uVar38 + uVar47 + ((uVar40 ^ uVar22) & uVar29 ^ uVar22) + -0x57ce3993;
    uVar13 = uVar13 + iVar8;
    uVar9 = ((uVar23 | uVar11) & uVar36 | uVar23 & uVar11) +
            ((uVar23 * 0x400 | uVar23 >> 0x16) ^
            (uVar23 * 0x80000 | uVar23 >> 0xd) ^ (uVar23 * 0x40000000 | uVar23 >> 2)) + iVar8;
    uVar18 = (uVar37 >> 3 ^
             (uVar58 << 0xe | uVar37 >> 0x12) ^ ((uVar14 >> 0x18) << 0x19 | uVar37 >> 7)) + uVar52 +
             uVar42 + (uVar10 >> 10 ^
                      (uVar10 * 0x2000 | uVar10 >> 0x13) ^ (uVar10 * 0x8000 | uVar10 >> 0x11));
    iVar8 = ((uVar13 * 0x80 | uVar13 >> 0x19) ^
            (uVar13 * 0x200000 | uVar13 >> 0xb) ^ (uVar13 * 0x4000000 | uVar13 >> 6)) +
            uVar22 + uVar18 + ((uVar29 ^ uVar40) & uVar13 ^ uVar40) + -0x4ffcd838;
    uVar36 = uVar36 + iVar8;
    uVar14 = ((uVar9 | uVar23) & uVar11 | uVar9 & uVar23) +
             ((uVar9 * 0x400 | uVar9 >> 0x16) ^
             (uVar9 * 0x80000 | uVar9 >> 0xd) ^ (uVar9 * 0x40000000 | uVar9 >> 2)) + iVar8;
    uVar49 = (uVar25 >> 3 ^
             (uVar60 << 0xe | uVar25 >> 0x12) ^ ((uVar24 >> 0x18) << 0x19 | uVar25 >> 7)) + uVar37 +
             uVar17 + (uVar47 >> 10 ^
                      (uVar47 * 0x2000 | uVar47 >> 0x13) ^ (uVar47 * 0x8000 | uVar47 >> 0x11));
    iVar8 = ((uVar36 * 0x80 | uVar36 >> 0x19) ^
            (uVar36 * 0x200000 | uVar36 >> 0xb) ^ (uVar36 * 0x4000000 | uVar36 >> 6)) +
            uVar40 + uVar49 + ((uVar13 ^ uVar29) & uVar36 ^ uVar29) + -0x40a68039;
    uVar11 = uVar11 + iVar8;
    uVar22 = ((uVar14 | uVar9) & uVar23 | uVar14 & uVar9) +
             ((uVar14 * 0x400 | uVar14 >> 0x16) ^
             (uVar14 * 0x80000 | uVar14 >> 0xd) ^ (uVar14 * 0x40000000 | uVar14 >> 2)) + iVar8;
    uVar60 = (uVar26 >> 3 ^
             (uVar61 << 0xe | uVar26 >> 0x12) ^ ((uVar30 >> 0x18) << 0x19 | uVar26 >> 7)) + uVar25 +
             uVar43 + (uVar18 >> 10 ^
                      (uVar18 * 0x2000 | uVar18 >> 0x13) ^ (uVar18 * 0x8000 | uVar18 >> 0x11));
    iVar8 = ((uVar11 * 0x80 | uVar11 >> 0x19) ^
            (uVar11 * 0x200000 | uVar11 >> 0xb) ^ (uVar11 * 0x4000000 | uVar11 >> 6)) +
            uVar29 + uVar60 + ((uVar36 ^ uVar13) & uVar11 ^ uVar13) + -0x391ff40d;
    uVar23 = uVar23 + iVar8;
    uVar19 = ((uVar22 | uVar14) & uVar9 | uVar22 & uVar14) +
             ((uVar22 * 0x400 | uVar22 >> 0x16) ^
             (uVar22 * 0x80000 | uVar22 >> 0xd) ^ (uVar22 * 0x40000000 | uVar22 >> 2)) + iVar8;
    uVar61 = (uVar53 >> 3 ^
             (uVar62 << 0xe | uVar53 >> 0x12) ^ ((uVar41 >> 0x18) << 0x19 | uVar53 >> 7)) + uVar26 +
             uVar46 + (uVar49 >> 10 ^
                      (uVar49 * 0x2000 | uVar49 >> 0x13) ^ (uVar49 * 0x8000 | uVar49 >> 0x11));
    iVar8 = ((uVar23 * 0x80 | uVar23 >> 0x19) ^
            (uVar23 * 0x200000 | uVar23 >> 0xb) ^ (uVar23 * 0x4000000 | uVar23 >> 6)) +
            uVar13 + uVar61 + ((uVar11 ^ uVar36) & uVar23 ^ uVar36) + -0x2a586eb9;
    uVar9 = uVar9 + iVar8;
    uVar44 = ((uVar19 | uVar22) & uVar14 | uVar19 & uVar22) +
             ((uVar19 * 0x400 | uVar19 >> 0x16) ^
             (uVar19 * 0x80000 | uVar19 >> 0xd) ^ (uVar19 * 0x40000000 | uVar19 >> 2)) + iVar8;
    uVar29 = (uVar16 >> 3 ^
             (uVar63 << 0xe | uVar16 >> 0x12) ^ ((uVar15 >> 0x18) << 0x19 | uVar16 >> 7)) + uVar53 +
             uVar32 + (uVar60 >> 10 ^
                      (uVar60 * 0x2000 | uVar60 >> 0x13) ^ (uVar60 * 0x8000 | uVar60 >> 0x11));
    iVar8 = uVar36 + uVar29 + ((uVar23 ^ uVar11) & uVar9 ^ uVar11) +
            ((uVar9 * 0x80 | uVar9 >> 0x19) ^
            (uVar9 * 0x200000 | uVar9 >> 0xb) ^ (uVar9 * 0x4000000 | uVar9 >> 6)) + 0x6ca6351;
    uVar14 = uVar14 + iVar8;
    uVar12 = ((uVar44 | uVar19) & uVar22 | uVar44 & uVar19) +
             ((uVar44 * 0x400 | uVar44 >> 0x16) ^
             (uVar44 * 0x80000 | uVar44 >> 0xd) ^ (uVar44 * 0x40000000 | uVar44 >> 2)) + iVar8;
    uVar54 = (uVar34 >> 3 ^ (uVar34 * 0x4000 | uVar34 >> 0x12) ^ (uVar34 * 0x2000000 | uVar34 >> 7))
             + uVar16 + uVar10 +
             (uVar61 >> 10 ^ (uVar61 * 0x2000 | uVar61 >> 0x13) ^ (uVar61 * 0x8000 | uVar61 >> 0x11)
             );
    iVar8 = uVar11 + uVar54 + ((uVar9 ^ uVar23) & uVar14 ^ uVar23) +
            ((uVar14 * 0x80 | uVar14 >> 0x19) ^
            (uVar14 * 0x200000 | uVar14 >> 0xb) ^ (uVar14 * 0x4000000 | uVar14 >> 6)) + 0x14292967;
    uVar22 = uVar22 + iVar8;
    uVar41 = ((uVar12 | uVar44) & uVar19 | uVar12 & uVar44) +
             ((uVar12 * 0x400 | uVar12 >> 0x16) ^
             (uVar12 * 0x80000 | uVar12 >> 0xd) ^ (uVar12 * 0x40000000 | uVar12 >> 2)) + iVar8;
    uVar36 = (uVar21 >> 3 ^ (uVar21 * 0x4000 | uVar21 >> 0x12) ^ (uVar21 * 0x2000000 | uVar21 >> 7))
             + uVar34 + uVar47 +
             (uVar29 >> 10 ^ (uVar29 * 0x2000 | uVar29 >> 0x13) ^ (uVar29 * 0x8000 | uVar29 >> 0x11)
             );
    iVar8 = uVar23 + uVar36 + ((uVar14 ^ uVar9) & uVar22 ^ uVar9) +
            ((uVar22 * 0x80 | uVar22 >> 0x19) ^
            (uVar22 * 0x200000 | uVar22 >> 0xb) ^ (uVar22 * 0x4000000 | uVar22 >> 6)) + 0x27b70a85;
    uVar19 = uVar19 + iVar8;
    uVar30 = ((uVar41 | uVar12) & uVar44 | uVar41 & uVar12) +
             ((uVar41 * 0x400 | uVar41 >> 0x16) ^
             (uVar41 * 0x80000 | uVar41 >> 0xd) ^ (uVar41 * 0x40000000 | uVar41 >> 2)) + iVar8;
    uVar55 = (uVar39 >> 3 ^ (uVar39 * 0x4000 | uVar39 >> 0x12) ^ (uVar39 * 0x2000000 | uVar39 >> 7))
             + uVar21 + uVar18 +
             (uVar54 >> 10 ^ (uVar54 * 0x2000 | uVar54 >> 0x13) ^ (uVar54 * 0x8000 | uVar54 >> 0x11)
             );
    iVar8 = ((uVar19 * 0x80 | uVar19 >> 0x19) ^
            (uVar19 * 0x200000 | uVar19 >> 0xb) ^ (uVar19 * 0x4000000 | uVar19 >> 6)) +
            uVar9 + uVar55 + ((uVar22 ^ uVar14) & uVar19 ^ uVar14) + 0x2e1b2138;
    uVar44 = uVar44 + iVar8;
    uVar57 = ((uVar30 | uVar41) & uVar12 | uVar30 & uVar41) +
             ((uVar30 * 0x400 | uVar30 >> 0x16) ^
             (uVar30 * 0x80000 | uVar30 >> 0xd) ^ (uVar30 * 0x40000000 | uVar30 >> 2)) + iVar8;
    uVar38 = (uVar42 >> 3 ^ (uVar42 * 0x4000 | uVar42 >> 0x12) ^ (uVar42 * 0x2000000 | uVar42 >> 7))
             + uVar39 + uVar49 +
             (uVar36 >> 10 ^ (uVar36 * 0x2000 | uVar36 >> 0x13) ^ (uVar36 * 0x8000 | uVar36 >> 0x11)
             );
    iVar8 = ((uVar44 * 0x80 | uVar44 >> 0x19) ^
            (uVar44 * 0x200000 | uVar44 >> 0xb) ^ (uVar44 * 0x4000000 | uVar44 >> 6)) +
            uVar14 + uVar38 + ((uVar19 ^ uVar22) & uVar44 ^ uVar22) + 0x4d2c6dfc;
    uVar12 = uVar12 + iVar8;
    uVar58 = ((uVar57 | uVar30) & uVar41 | uVar57 & uVar30) +
             ((uVar57 * 0x400 | uVar57 >> 0x16) ^
             (uVar57 * 0x80000 | uVar57 >> 0xd) ^ (uVar57 * 0x40000000 | uVar57 >> 2)) + iVar8;
    uVar23 = (uVar17 >> 3 ^ (uVar17 * 0x4000 | uVar17 >> 0x12) ^ (uVar17 * 0x2000000 | uVar17 >> 7))
             + uVar42 + uVar60 +
             (uVar55 >> 10 ^ (uVar55 * 0x2000 | uVar55 >> 0x13) ^ (uVar55 * 0x8000 | uVar55 >> 0x11)
             );
    iVar8 = ((uVar12 * 0x80 | uVar12 >> 0x19) ^
            (uVar12 * 0x200000 | uVar12 >> 0xb) ^ (uVar12 * 0x4000000 | uVar12 >> 6)) +
            uVar22 + uVar23 + ((uVar44 ^ uVar19) & uVar12 ^ uVar19) + 0x53380d13;
    uVar41 = uVar41 + iVar8;
    uVar24 = ((uVar58 | uVar57) & uVar30 | uVar58 & uVar57) +
             ((uVar58 * 0x400 | uVar58 >> 0x16) ^
             (uVar58 * 0x80000 | uVar58 >> 0xd) ^ (uVar58 * 0x40000000 | uVar58 >> 2)) + iVar8;
    uVar15 = (uVar43 >> 3 ^ (uVar43 * 0x4000 | uVar43 >> 0x12) ^ (uVar43 * 0x2000000 | uVar43 >> 7))
             + uVar17 + uVar61 +
             (uVar38 >> 10 ^ (uVar38 * 0x2000 | uVar38 >> 0x13) ^ (uVar38 * 0x8000 | uVar38 >> 0x11)
             );
    iVar8 = ((uVar41 * 0x80 | uVar41 >> 0x19) ^
            (uVar41 * 0x200000 | uVar41 >> 0xb) ^ (uVar41 * 0x4000000 | uVar41 >> 6)) +
            uVar19 + uVar15 + ((uVar12 ^ uVar44) & uVar41 ^ uVar44) + 0x650a7354;
    uVar30 = uVar30 + iVar8;
    uVar22 = ((uVar24 | uVar58) & uVar57 | uVar24 & uVar58) +
             ((uVar24 * 0x400 | uVar24 >> 0x16) ^
             (uVar24 * 0x80000 | uVar24 >> 0xd) ^ (uVar24 * 0x40000000 | uVar24 >> 2)) + iVar8;
    uVar39 = (uVar46 >> 3 ^ (uVar46 * 0x4000 | uVar46 >> 0x12) ^ (uVar46 * 0x2000000 | uVar46 >> 7))
             + uVar43 + uVar29 +
             (uVar23 >> 10 ^ (uVar23 * 0x2000 | uVar23 >> 0x13) ^ (uVar23 * 0x8000 | uVar23 >> 0x11)
             );
    iVar8 = ((uVar30 * 0x80 | uVar30 >> 0x19) ^
            (uVar30 * 0x200000 | uVar30 >> 0xb) ^ (uVar30 * 0x4000000 | uVar30 >> 6)) +
            uVar44 + uVar39 + ((uVar41 ^ uVar12) & uVar30 ^ uVar12) + 0x766a0abb;
    uVar57 = uVar57 + iVar8;
    uVar11 = ((uVar22 | uVar24) & uVar58 | uVar22 & uVar24) +
             ((uVar22 * 0x400 | uVar22 >> 0x16) ^
             (uVar22 * 0x80000 | uVar22 >> 0xd) ^ (uVar22 * 0x40000000 | uVar22 >> 2)) + iVar8;
    uVar9 = (uVar32 >> 3 ^ (uVar32 * 0x4000 | uVar32 >> 0x12) ^ (uVar32 * 0x2000000 | uVar32 >> 7))
            + uVar46 + uVar54 +
            (uVar15 >> 10 ^ (uVar15 * 0x2000 | uVar15 >> 0x13) ^ (uVar15 * 0x8000 | uVar15 >> 0x11))
    ;
    iVar8 = ((uVar57 * 0x80 | uVar57 >> 0x19) ^
            (uVar57 * 0x200000 | uVar57 >> 0xb) ^ (uVar57 * 0x4000000 | uVar57 >> 6)) +
            uVar12 + uVar9 + ((uVar30 ^ uVar41) & uVar57 ^ uVar41) + -0x7e3d36d2;
    uVar58 = uVar58 + iVar8;
    uVar14 = ((uVar11 | uVar22) & uVar24 | uVar11 & uVar22) +
             ((uVar11 * 0x400 | uVar11 >> 0x16) ^
             (uVar11 * 0x80000 | uVar11 >> 0xd) ^ (uVar11 * 0x40000000 | uVar11 >> 2)) + iVar8;
    uVar13 = (uVar10 >> 3 ^ (uVar10 * 0x4000 | uVar10 >> 0x12) ^ (uVar10 * 0x2000000 | uVar10 >> 7))
             + uVar32 + uVar36 +
             (uVar39 >> 10 ^ (uVar39 * 0x2000 | uVar39 >> 0x13) ^ (uVar39 * 0x8000 | uVar39 >> 0x11)
             );
    iVar8 = ((uVar58 * 0x80 | uVar58 >> 0x19) ^
            (uVar58 * 0x200000 | uVar58 >> 0xb) ^ (uVar58 * 0x4000000 | uVar58 >> 6)) +
            uVar41 + uVar13 + ((uVar57 ^ uVar30) & uVar58 ^ uVar30) + -0x6d8dd37b;
    uVar24 = uVar24 + iVar8;
    uVar34 = ((uVar14 | uVar11) & uVar22 | uVar14 & uVar11) +
             ((uVar14 * 0x400 | uVar14 >> 0x16) ^
             (uVar14 * 0x80000 | uVar14 >> 0xd) ^ (uVar14 * 0x40000000 | uVar14 >> 2)) + iVar8;
    uVar62 = (uVar47 >> 3 ^ (uVar47 * 0x4000 | uVar47 >> 0x12) ^ (uVar47 * 0x2000000 | uVar47 >> 7))
             + uVar10 + uVar55 +
             (uVar9 >> 10 ^ (uVar9 * 0x2000 | uVar9 >> 0x13) ^ (uVar9 * 0x8000 | uVar9 >> 0x11));
    iVar8 = uVar30 + uVar62 + ((uVar58 ^ uVar57) & uVar24 ^ uVar57) +
            ((uVar24 * 0x80 | uVar24 >> 0x19) ^
            (uVar24 * 0x200000 | uVar24 >> 0xb) ^ (uVar24 * 0x4000000 | uVar24 >> 6)) + -0x5d40175f;
    uVar22 = uVar22 + iVar8;
    uVar41 = ((uVar34 | uVar14) & uVar11 | uVar34 & uVar14) +
             ((uVar34 * 0x400 | uVar34 >> 0x16) ^
             (uVar34 * 0x80000 | uVar34 >> 0xd) ^ (uVar34 * 0x40000000 | uVar34 >> 2)) + iVar8;
    uVar44 = (uVar18 >> 3 ^ (uVar18 * 0x4000 | uVar18 >> 0x12) ^ (uVar18 * 0x2000000 | uVar18 >> 7))
             + uVar47 + uVar38 +
             (uVar13 >> 10 ^ (uVar13 * 0x2000 | uVar13 >> 0x13) ^ (uVar13 * 0x8000 | uVar13 >> 0x11)
             );
    iVar8 = ((uVar22 * 0x80 | uVar22 >> 0x19) ^
            (uVar22 * 0x200000 | uVar22 >> 0xb) ^ (uVar22 * 0x4000000 | uVar22 >> 6)) +
            uVar57 + uVar44 + ((uVar24 ^ uVar58) & uVar22 ^ uVar58) + -0x57e599b5;
    uVar11 = uVar11 + iVar8;
    uVar32 = ((uVar41 | uVar34) & uVar14 | uVar41 & uVar34) +
             ((uVar41 * 0x400 | uVar41 >> 0x16) ^
             (uVar41 * 0x80000 | uVar41 >> 0xd) ^ (uVar41 * 0x40000000 | uVar41 >> 2)) + iVar8;
    uVar12 = (uVar49 >> 3 ^ (uVar49 * 0x4000 | uVar49 >> 0x12) ^ (uVar49 * 0x2000000 | uVar49 >> 7))
             + uVar18 + uVar23 +
             (uVar62 >> 10 ^ (uVar62 * 0x2000 | uVar62 >> 0x13) ^ (uVar62 * 0x8000 | uVar62 >> 0x11)
             );
    iVar8 = ((uVar11 * 0x80 | uVar11 >> 0x19) ^
            (uVar11 * 0x200000 | uVar11 >> 0xb) ^ (uVar11 * 0x4000000 | uVar11 >> 6)) +
            uVar58 + uVar12 + ((uVar22 ^ uVar24) & uVar11 ^ uVar24) + -0x3db47490;
    uVar14 = uVar14 + iVar8;
    uVar63 = ((uVar32 | uVar41) & uVar34 | uVar32 & uVar41) +
             ((uVar32 * 0x400 | uVar32 >> 0x16) ^
             (uVar32 * 0x80000 | uVar32 >> 0xd) ^ (uVar32 * 0x40000000 | uVar32 >> 2)) + iVar8;
    uVar46 = (uVar60 >> 3 ^ (uVar60 * 0x4000 | uVar60 >> 0x12) ^ (uVar60 * 0x2000000 | uVar60 >> 7))
             + uVar49 + uVar15 +
             (uVar44 >> 10 ^ (uVar44 * 0x2000 | uVar44 >> 0x13) ^ (uVar44 * 0x8000 | uVar44 >> 0x11)
             );
    iVar8 = ((uVar14 * 0x80 | uVar14 >> 0x19) ^
            (uVar14 * 0x200000 | uVar14 >> 0xb) ^ (uVar14 * 0x4000000 | uVar14 >> 6)) +
            uVar24 + uVar46 + ((uVar11 ^ uVar22) & uVar14 ^ uVar22) + -0x3893ae5d;
    uVar34 = uVar34 + iVar8;
    uVar10 = ((uVar63 | uVar32) & uVar41 | uVar63 & uVar32) +
             ((uVar63 * 0x400 | uVar63 >> 0x16) ^
             (uVar63 * 0x80000 | uVar63 >> 0xd) ^ (uVar63 * 0x40000000 | uVar63 >> 2)) + iVar8;
    uVar57 = (uVar61 >> 3 ^ (uVar61 * 0x4000 | uVar61 >> 0x12) ^ (uVar61 * 0x2000000 | uVar61 >> 7))
             + uVar60 + uVar39 +
             (uVar12 >> 10 ^ (uVar12 * 0x2000 | uVar12 >> 0x13) ^ (uVar12 * 0x8000 | uVar12 >> 0x11)
             );
    iVar8 = uVar22 + uVar57 + ((uVar14 ^ uVar11) & uVar34 ^ uVar11) +
            ((uVar34 * 0x80 | uVar34 >> 0x19) ^
            (uVar34 * 0x200000 | uVar34 >> 0xb) ^ (uVar34 * 0x4000000 | uVar34 >> 6)) + -0x2e6d17e7;
    uVar41 = uVar41 + iVar8;
    uVar49 = ((uVar10 | uVar63) & uVar32 | uVar10 & uVar63) +
             ((uVar10 * 0x400 | uVar10 >> 0x16) ^
             (uVar10 * 0x80000 | uVar10 >> 0xd) ^ (uVar10 * 0x40000000 | uVar10 >> 2)) + iVar8;
    uVar24 = (uVar29 >> 3 ^ (uVar29 * 0x4000 | uVar29 >> 0x12) ^ (uVar29 * 0x2000000 | uVar29 >> 7))
             + uVar61 + uVar9 +
             (uVar46 >> 10 ^ (uVar46 * 0x2000 | uVar46 >> 0x13) ^ (uVar46 * 0x8000 | uVar46 >> 0x11)
             );
    iVar8 = ((uVar41 * 0x80 | uVar41 >> 0x19) ^
            (uVar41 * 0x200000 | uVar41 >> 0xb) ^ (uVar41 * 0x4000000 | uVar41 >> 6)) +
            uVar11 + uVar24 + ((uVar34 ^ uVar14) & uVar41 ^ uVar14) + -0x2966f9dc;
    uVar32 = uVar32 + iVar8;
    uVar58 = ((uVar49 | uVar10) & uVar63 | uVar49 & uVar10) +
             ((uVar49 * 0x400 | uVar49 >> 0x16) ^
             (uVar49 * 0x80000 | uVar49 >> 0xd) ^ (uVar49 * 0x40000000 | uVar49 >> 2)) + iVar8;
    uVar43 = (uVar54 >> 3 ^ (uVar54 * 0x4000 | uVar54 >> 0x12) ^ (uVar54 * 0x2000000 | uVar54 >> 7))
             + uVar29 + uVar13 +
             (uVar57 >> 10 ^ (uVar57 * 0x2000 | uVar57 >> 0x13) ^ (uVar57 * 0x8000 | uVar57 >> 0x11)
             );
    iVar8 = ((uVar32 * 0x80 | uVar32 >> 0x19) ^
            (uVar32 * 0x200000 | uVar32 >> 0xb) ^ (uVar32 * 0x4000000 | uVar32 >> 6)) +
            uVar14 + uVar43 + ((uVar41 ^ uVar34) & uVar32 ^ uVar34) + -0xbf1ca7b;
    uVar63 = uVar63 + iVar8;
    uVar47 = ((uVar58 | uVar49) & uVar10 | uVar58 & uVar49) +
             ((uVar58 * 0x400 | uVar58 >> 0x16) ^
             (uVar58 * 0x80000 | uVar58 >> 0xd) ^ (uVar58 * 0x40000000 | uVar58 >> 2)) + iVar8;
    uVar29 = (uVar36 >> 3 ^ (uVar36 * 0x4000 | uVar36 >> 0x12) ^ (uVar36 * 0x2000000 | uVar36 >> 7))
             + uVar54 + uVar62 +
             (uVar24 >> 10 ^ (uVar24 * 0x2000 | uVar24 >> 0x13) ^ (uVar24 * 0x8000 | uVar24 >> 0x11)
             );
    iVar8 = ((uVar63 * 0x80 | uVar63 >> 0x19) ^
            (uVar63 * 0x200000 | uVar63 >> 0xb) ^ (uVar63 * 0x4000000 | uVar63 >> 6)) +
            uVar34 + uVar29 + ((uVar32 ^ uVar41) & uVar63 ^ uVar41) + 0x106aa070;
    uVar10 = uVar10 + iVar8;
    uVar42 = ((uVar47 | uVar58) & uVar49 | uVar47 & uVar58) +
             ((uVar47 * 0x400 | uVar47 >> 0x16) ^
             (uVar47 * 0x80000 | uVar47 >> 0xd) ^ (uVar47 * 0x40000000 | uVar47 >> 2)) + iVar8;
    uVar30 = (uVar55 >> 3 ^ (uVar55 * 0x4000 | uVar55 >> 0x12) ^ (uVar55 * 0x2000000 | uVar55 >> 7))
             + uVar36 + uVar44 +
             (uVar43 >> 10 ^ (uVar43 * 0x2000 | uVar43 >> 0x13) ^ (uVar43 * 0x8000 | uVar43 >> 0x11)
             );
    iVar8 = ((uVar10 * 0x80 | uVar10 >> 0x19) ^
            (uVar10 * 0x200000 | uVar10 >> 0xb) ^ (uVar10 * 0x4000000 | uVar10 >> 6)) +
            uVar41 + uVar30 + ((uVar63 ^ uVar32) & uVar10 ^ uVar32) + 0x19a4c116;
    uVar49 = uVar49 + iVar8;
    uVar34 = ((uVar42 | uVar47) & uVar58 | uVar42 & uVar47) +
             ((uVar42 * 0x400 | uVar42 >> 0x16) ^
             (uVar42 * 0x80000 | uVar42 >> 0xd) ^ (uVar42 * 0x40000000 | uVar42 >> 2)) + iVar8;
    uVar11 = (uVar38 >> 3 ^ (uVar38 * 0x4000 | uVar38 >> 0x12) ^ (uVar38 * 0x2000000 | uVar38 >> 7))
             + uVar55 + uVar12 +
             (uVar29 >> 10 ^ (uVar29 * 0x2000 | uVar29 >> 0x13) ^ (uVar29 * 0x8000 | uVar29 >> 0x11)
             );
    iVar8 = ((uVar49 * 0x80 | uVar49 >> 0x19) ^
            (uVar49 * 0x200000 | uVar49 >> 0xb) ^ (uVar49 * 0x4000000 | uVar49 >> 6)) +
            uVar32 + uVar11 + ((uVar10 ^ uVar63) & uVar49 ^ uVar63) + 0x1e376c08;
    uVar58 = uVar58 + iVar8;
    uVar60 = ((uVar34 | uVar42) & uVar47 | uVar34 & uVar42) +
             ((uVar34 * 0x400 | uVar34 >> 0x16) ^
             (uVar34 * 0x80000 | uVar34 >> 0xd) ^ (uVar34 * 0x40000000 | uVar34 >> 2)) + iVar8;
    uVar22 = (uVar23 >> 3 ^ (uVar23 * 0x4000 | uVar23 >> 0x12) ^ (uVar23 * 0x2000000 | uVar23 >> 7))
             + uVar38 + uVar46 +
             (uVar30 >> 10 ^ (uVar30 * 0x2000 | uVar30 >> 0x13) ^ (uVar30 * 0x8000 | uVar30 >> 0x11)
             );
    iVar8 = ((uVar58 * 0x80 | uVar58 >> 0x19) ^
            (uVar58 * 0x200000 | uVar58 >> 0xb) ^ (uVar58 * 0x4000000 | uVar58 >> 6)) +
            uVar63 + uVar22 + ((uVar49 ^ uVar10) & uVar58 ^ uVar10) + 0x2748774c;
    uVar47 = uVar47 + iVar8;
    uVar55 = ((uVar60 | uVar34) & uVar42 | uVar60 & uVar34) +
             ((uVar60 * 0x400 | uVar60 >> 0x16) ^
             (uVar60 * 0x80000 | uVar60 >> 0xd) ^ (uVar60 * 0x40000000 | uVar60 >> 2)) + iVar8;
    uVar41 = (uVar15 >> 3 ^ (uVar15 * 0x4000 | uVar15 >> 0x12) ^ (uVar15 * 0x2000000 | uVar15 >> 7))
             + uVar23 + uVar57 +
             (uVar11 >> 10 ^ (uVar11 * 0x2000 | uVar11 >> 0x13) ^ (uVar11 * 0x8000 | uVar11 >> 0x11)
             );
    iVar8 = ((uVar47 * 0x80 | uVar47 >> 0x19) ^
            (uVar47 * 0x200000 | uVar47 >> 0xb) ^ (uVar47 * 0x4000000 | uVar47 >> 6)) +
            uVar10 + uVar41 + ((uVar58 ^ uVar49) & uVar47 ^ uVar49) + 0x34b0bcb5;
    uVar42 = uVar42 + iVar8;
    uVar23 = ((uVar55 | uVar60) & uVar34 | uVar55 & uVar60) +
             ((uVar55 * 0x400 | uVar55 >> 0x16) ^
             (uVar55 * 0x80000 | uVar55 >> 0xd) ^ (uVar55 * 0x40000000 | uVar55 >> 2)) + iVar8;
    uVar14 = (uVar39 >> 3 ^ (uVar39 * 0x4000 | uVar39 >> 0x12) ^ (uVar39 * 0x2000000 | uVar39 >> 7))
             + uVar15 + uVar24 +
             (uVar22 >> 10 ^ (uVar22 * 0x2000 | uVar22 >> 0x13) ^ (uVar22 * 0x8000 | uVar22 >> 0x11)
             );
    iVar8 = ((uVar42 * 0x80 | uVar42 >> 0x19) ^
            (uVar42 * 0x200000 | uVar42 >> 0xb) ^ (uVar42 * 0x4000000 | uVar42 >> 6)) +
            uVar49 + uVar14 + ((uVar47 ^ uVar58) & uVar42 ^ uVar58) + 0x391c0cb3;
    uVar34 = uVar34 + iVar8;
    uVar38 = ((uVar23 | uVar55) & uVar60 | uVar23 & uVar55) +
             ((uVar23 * 0x400 | uVar23 >> 0x16) ^
             (uVar23 * 0x80000 | uVar23 >> 0xd) ^ (uVar23 * 0x40000000 | uVar23 >> 2)) + iVar8;
    uVar36 = (uVar9 >> 3 ^ (uVar9 * 0x4000 | uVar9 >> 0x12) ^ (uVar9 * 0x2000000 | uVar9 >> 7)) +
             uVar39 + uVar43 +
             (uVar41 >> 10 ^ (uVar41 * 0x2000 | uVar41 >> 0x13) ^ (uVar41 * 0x8000 | uVar41 >> 0x11)
             );
    iVar8 = ((uVar34 * 0x80 | uVar34 >> 0x19) ^
            (uVar34 * 0x200000 | uVar34 >> 0xb) ^ (uVar34 * 0x4000000 | uVar34 >> 6)) +
            uVar58 + uVar36 + ((uVar42 ^ uVar47) & uVar34 ^ uVar47) + 0x4ed8aa4a;
    uVar60 = uVar60 + iVar8;
    uVar15 = ((uVar38 | uVar23) & uVar55 | uVar38 & uVar23) +
             ((uVar38 * 0x400 | uVar38 >> 0x16) ^
             (uVar38 * 0x80000 | uVar38 >> 0xd) ^ (uVar38 * 0x40000000 | uVar38 >> 2)) + iVar8;
    uVar54 = (uVar13 >> 3 ^ (uVar13 * 0x4000 | uVar13 >> 0x12) ^ (uVar13 * 0x2000000 | uVar13 >> 7))
             + uVar9 + uVar29 +
             (uVar14 >> 10 ^ (uVar14 * 0x2000 | uVar14 >> 0x13) ^ (uVar14 * 0x8000 | uVar14 >> 0x11)
             );
    iVar8 = ((uVar60 * 0x80 | uVar60 >> 0x19) ^
            (uVar60 * 0x200000 | uVar60 >> 0xb) ^ (uVar60 * 0x4000000 | uVar60 >> 6)) +
            uVar47 + uVar54 + ((uVar34 ^ uVar42) & uVar60 ^ uVar42) + 0x5b9cca4f;
    uVar55 = uVar55 + iVar8;
    uVar10 = ((uVar15 | uVar38) & uVar23 | uVar15 & uVar38) +
             ((uVar15 * 0x400 | uVar15 >> 0x16) ^
             (uVar15 * 0x80000 | uVar15 >> 0xd) ^ (uVar15 * 0x40000000 | uVar15 >> 2)) + iVar8;
    uVar39 = (uVar62 >> 3 ^ (uVar62 * 0x4000 | uVar62 >> 0x12) ^ (uVar62 * 0x2000000 | uVar62 >> 7))
             + uVar13 + uVar30 +
             (uVar36 >> 10 ^ (uVar36 * 0x2000 | uVar36 >> 0x13) ^ (uVar36 * 0x8000 | uVar36 >> 0x11)
             );
    iVar8 = ((uVar55 * 0x80 | uVar55 >> 0x19) ^
            (uVar55 * 0x200000 | uVar55 >> 0xb) ^ (uVar55 * 0x4000000 | uVar55 >> 6)) +
            uVar42 + uVar39 + ((uVar60 ^ uVar34) & uVar55 ^ uVar34) + 0x682e6ff3;
    uVar23 = uVar23 + iVar8;
    uVar9 = ((uVar10 | uVar15) & uVar38 | uVar10 & uVar15) +
            ((uVar10 * 0x400 | uVar10 >> 0x16) ^
            (uVar10 * 0x80000 | uVar10 >> 0xd) ^ (uVar10 * 0x40000000 | uVar10 >> 2)) + iVar8;
    uVar49 = (uVar44 >> 3 ^ (uVar44 * 0x4000 | uVar44 >> 0x12) ^ (uVar44 * 0x2000000 | uVar44 >> 7))
             + uVar62 + uVar11 +
             (uVar54 >> 10 ^ (uVar54 * 0x2000 | uVar54 >> 0x13) ^ (uVar54 * 0x8000 | uVar54 >> 0x11)
             );
    iVar8 = ((uVar23 * 0x80 | uVar23 >> 0x19) ^
            (uVar23 * 0x200000 | uVar23 >> 0xb) ^ (uVar23 * 0x4000000 | uVar23 >> 6)) +
            uVar34 + uVar49 + ((uVar55 ^ uVar60) & uVar23 ^ uVar60) + 0x748f82ee;
    uVar38 = uVar38 + iVar8;
    uVar11 = ((uVar9 | uVar10) & uVar15 | uVar9 & uVar10) +
             ((uVar9 * 0x400 | uVar9 >> 0x16) ^
             (uVar9 * 0x80000 | uVar9 >> 0xd) ^ (uVar9 * 0x40000000 | uVar9 >> 2)) + iVar8;
    uVar22 = (uVar12 >> 3 ^ (uVar12 * 0x4000 | uVar12 >> 0x12) ^ (uVar12 * 0x2000000 | uVar12 >> 7))
             + uVar44 + uVar22 +
             (uVar39 >> 10 ^ (uVar39 * 0x2000 | uVar39 >> 0x13) ^ (uVar39 * 0x8000 | uVar39 >> 0x11)
             );
    iVar8 = ((uVar38 * 0x80 | uVar38 >> 0x19) ^
            (uVar38 * 0x200000 | uVar38 >> 0xb) ^ (uVar38 * 0x4000000 | uVar38 >> 6)) +
            uVar60 + uVar22 + ((uVar23 ^ uVar55) & uVar38 ^ uVar55) + 0x78a5636f;
    uVar15 = uVar15 + iVar8;
    uVar44 = ((uVar11 | uVar9) & uVar10 | uVar11 & uVar9) +
             ((uVar11 * 0x400 | uVar11 >> 0x16) ^
             (uVar11 * 0x80000 | uVar11 >> 0xd) ^ (uVar11 * 0x40000000 | uVar11 >> 2)) + iVar8;
    uVar34 = (uVar46 >> 3 ^ (uVar46 * 0x4000 | uVar46 >> 0x12) ^ (uVar46 * 0x2000000 | uVar46 >> 7))
             + uVar12 + uVar41 +
             (uVar49 >> 10 ^ (uVar49 * 0x2000 | uVar49 >> 0x13) ^ (uVar49 * 0x8000 | uVar49 >> 0x11)
             );
    iVar8 = ((uVar15 * 0x80 | uVar15 >> 0x19) ^
            (uVar15 * 0x200000 | uVar15 >> 0xb) ^ (uVar15 * 0x4000000 | uVar15 >> 6)) +
            uVar55 + uVar34 + ((uVar38 ^ uVar23) & uVar15 ^ uVar23) + -0x7b3787ec;
    uVar10 = uVar10 + iVar8;
    uVar41 = ((uVar44 | uVar11) & uVar9 | uVar44 & uVar11) +
             ((uVar44 * 0x400 | uVar44 >> 0x16) ^
             (uVar44 * 0x80000 | uVar44 >> 0xd) ^ (uVar44 * 0x40000000 | uVar44 >> 2)) + iVar8;
    uVar12 = (uVar57 >> 3 ^ (uVar57 * 0x4000 | uVar57 >> 0x12) ^ (uVar57 * 0x2000000 | uVar57 >> 7))
             + uVar46 + uVar14 +
             (uVar22 >> 10 ^ (uVar22 * 0x2000 | uVar22 >> 0x13) ^ (uVar22 * 0x8000 | uVar22 >> 0x11)
             );
    iVar8 = ((uVar10 * 0x80 | uVar10 >> 0x19) ^
            (uVar10 * 0x200000 | uVar10 >> 0xb) ^ (uVar10 * 0x4000000 | uVar10 >> 6)) +
            uVar23 + uVar12 + ((uVar15 ^ uVar38) & uVar10 ^ uVar38) + -0x7338fdf8;
    uVar9 = uVar9 + iVar8;
    uVar22 = ((uVar41 | uVar44) & uVar11 | uVar41 & uVar44) +
             ((uVar41 * 0x400 | uVar41 >> 0x16) ^
             (uVar41 * 0x80000 | uVar41 >> 0xd) ^ (uVar41 * 0x40000000 | uVar41 >> 2)) + iVar8;
    uVar14 = (uVar24 >> 3 ^ (uVar24 * 0x4000 | uVar24 >> 0x12) ^ (uVar24 * 0x2000000 | uVar24 >> 7))
             + uVar57 + uVar36 +
             (uVar34 >> 10 ^ (uVar34 * 0x2000 | uVar34 >> 0x13) ^ (uVar34 * 0x8000 | uVar34 >> 0x11)
             );
    iVar8 = ((uVar9 * 0x80 | uVar9 >> 0x19) ^
            (uVar9 * 0x200000 | uVar9 >> 0xb) ^ (uVar9 * 0x4000000 | uVar9 >> 6)) +
            uVar38 + uVar14 + ((uVar10 ^ uVar15) & uVar9 ^ uVar15) + -0x6f410006;
    uVar11 = uVar11 + iVar8;
    uVar36 = ((uVar22 | uVar41) & uVar44 | uVar22 & uVar41) +
             ((uVar22 * 0x400 | uVar22 >> 0x16) ^
             (uVar22 * 0x80000 | uVar22 >> 0xd) ^ (uVar22 * 0x40000000 | uVar22 >> 2)) + iVar8;
    uVar12 = (uVar43 >> 3 ^ (uVar43 * 0x4000 | uVar43 >> 0x12) ^ (uVar43 * 0x2000000 | uVar43 >> 7))
             + uVar24 + uVar54 +
             (uVar12 >> 10 ^ (uVar12 * 0x2000 | uVar12 >> 0x13) ^ (uVar12 * 0x8000 | uVar12 >> 0x11)
             );
    iVar8 = ((uVar11 * 0x80 | uVar11 >> 0x19) ^
            (uVar11 * 0x200000 | uVar11 >> 0xb) ^ (uVar11 * 0x4000000 | uVar11 >> 6)) +
            uVar15 + uVar12 + ((uVar9 ^ uVar10) & uVar11 ^ uVar10) + -0x5baf9315;
    uVar44 = uVar44 + iVar8;
    uVar23 = ((uVar36 | uVar22) & uVar41 | uVar36 & uVar22) +
             ((uVar36 * 0x400 | uVar36 >> 0x16) ^
             (uVar36 * 0x80000 | uVar36 >> 0xd) ^ (uVar36 * 0x40000000 | uVar36 >> 2)) + iVar8;
    iVar8 = (uVar29 >> 3 ^ (uVar29 * 0x4000 | uVar29 >> 0x12) ^ (uVar29 * 0x2000000 | uVar29 >> 7))
            + uVar43 + uVar39 +
            (uVar14 >> 10 ^ (uVar14 * 0x2000 | uVar14 >> 0x13) ^ (uVar14 * 0x8000 | uVar14 >> 0x11))
            + uVar10 + ((uVar11 ^ uVar9) & uVar44 ^ uVar9) +
            ((uVar44 * 0x80 | uVar44 >> 0x19) ^
            (uVar44 * 0x200000 | uVar44 >> 0xb) ^ (uVar44 * 0x4000000 | uVar44 >> 6)) + -0x41065c09;
    uVar41 = uVar41 + iVar8;
    uVar10 = ((uVar23 | uVar36) & uVar22 | uVar23 & uVar36) +
             ((uVar23 * 0x400 | uVar23 >> 0x16) ^
             (uVar23 * 0x80000 | uVar23 >> 0xd) ^ (uVar23 * 0x40000000 | uVar23 >> 2)) + iVar8;
    iVar8 = (uVar30 >> 3 ^ (uVar30 * 0x4000 | uVar30 >> 0x12) ^ (uVar30 * 0x2000000 | uVar30 >> 7))
            + uVar29 + uVar49 +
            (uVar12 >> 10 ^ (uVar12 * 0x2000 | uVar12 >> 0x13) ^ (uVar12 * 0x8000 | uVar12 >> 0x11))
            + uVar9 + ((uVar44 ^ uVar11) & uVar41 ^ uVar11) +
            ((uVar41 * 0x80 | uVar41 >> 0x19) ^
            (uVar41 * 0x200000 | uVar41 >> 0xb) ^ (uVar41 * 0x4000000 | uVar41 >> 6)) + -0x398e870e;
    hash->s[0] = ((uVar10 | uVar23) & uVar36 | uVar10 & uVar23) + uVar27 +
                 ((uVar10 * 0x400 | uVar10 >> 0x16) ^
                 (uVar10 * 0x80000 | uVar10 >> 0xd) ^ (uVar10 * 0x40000000 | uVar10 >> 2)) + iVar8;
    hash->s[1] = uVar10 + uVar1;
    hash->s[2] = uVar23 + uVar2;
    hash->s[3] = uVar36 + uVar3;
    hash->s[4] = uVar22 + uVar4 + iVar8;
    hash->s[5] = uVar41 + uVar5;
    hash->s[6] = uVar44 + uVar6;
    hash->s[7] = uVar11 + uVar7;
    uVar27 = 0;
    len = len - __n;
  }
  if (len != 0) {
    memcpy((void *)((long)hash->buf + uVar35),local_d0,len);
    return;
  }
  return;
}

Assistant:

static void secp256k1_sha256_write(secp256k1_sha256 *hash, const unsigned char *data, size_t len) {
    size_t bufsize = hash->bytes & 0x3F;
    hash->bytes += len;
    VERIFY_CHECK(hash->bytes >= len);
    while (len >= 64 - bufsize) {
        /* Fill the buffer, and process it. */
        size_t chunk_len = 64 - bufsize;
        memcpy(((unsigned char*)hash->buf) + bufsize, data, chunk_len);
        data += chunk_len;
        len -= chunk_len;
        secp256k1_sha256_transform(hash->s, hash->buf);
        bufsize = 0;
    }
    if (len) {
        /* Fill the buffer with what remains. */
        memcpy(((unsigned char*)hash->buf) + bufsize, data, len);
    }
}